

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

LispPTR UFS_deletefile(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  DLword *pDVar8;
  bool bVar9;
  stat sbuf;
  char fbuf [4096];
  char file [4096];
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
    pLVar4 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar4 + 6) == 'D') {
      LVar3 = pLVar4[2] * 2;
LAB_0012ea6b:
      iVar2 = 200;
      if (0xfff < (int)LVar3) goto LAB_0012ea21;
    }
    else {
      if (*(char *)((long)pLVar4 + 6) == 'C') {
        LVar3 = pLVar4[2];
        goto LAB_0012ea6b;
      }
      error("LispStringLength: Not a character array.\n");
    }
    pLVar4 = NativeAligned4FromLAddr(*args);
    LVar3 = 0x1000;
    if ((int)pLVar4[2] < 0x1000) {
      LVar3 = pLVar4[2];
    }
    lVar5 = (long)(int)LVar3;
    if (*(char *)((long)pLVar4 + 6) == 'D') {
      pDVar8 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        fbuf[lVar7] = *(char *)((ulong)pDVar8 ^ 2);
        pDVar8 = pDVar8 + 1;
      }
      fbuf[lVar7] = '\0';
    }
    else if (*(char *)((long)pLVar4 + 6) == 'C') {
      uVar1 = *pLVar4;
      LVar3 = pLVar4[1];
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        fbuf[lVar7] = *(char *)((long)Lisp_world +
                                lVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
      }
      fbuf[lVar5] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    iVar2 = unixpathname(fbuf,file,0,0);
    if (iVar2 == 0) {
      return 0;
    }
    alarm(TIMEOUT_TIME);
    piVar6 = __errno_location();
    do {
      *piVar6 = 0;
      iVar2 = stat(file,(stat *)&sbuf);
      if (iVar2 != -1) {
        alarm(0);
        alarm(TIMEOUT_TIME);
        if ((sbuf.st_mode & 0xf000) == 0x4000) {
          goto LAB_0012ebe1;
        }
        goto LAB_0012ec05;
      }
    } while (*piVar6 == 4);
    alarm(0);
    goto LAB_0012ec2c;
  }
  iVar2 = 100;
  goto LAB_0012ea21;
  while (*piVar6 == 4) {
LAB_0012ec05:
    *piVar6 = 0;
    iVar2 = unlink(file);
    bVar9 = iVar2 == -1;
    if (!bVar9) break;
  }
  goto LAB_0012ec1f;
  while (*piVar6 == 4) {
LAB_0012ebe1:
    *piVar6 = 0;
    iVar2 = rmdir(file);
    bVar9 = iVar2 == -1;
    if (!bVar9) break;
  }
LAB_0012ec1f:
  alarm(0);
  if (bVar9) {
LAB_0012ec2c:
    iVar2 = *piVar6;
LAB_0012ea21:
    *Lisp_errno = iVar2;
    LVar3 = 0;
  }
  else {
    LVar3 = 0x4c;
  }
  return LVar3;
}

Assistant:

LispPTR UFS_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN];
  struct stat sbuf;
  int len, rval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[1]));

  LispStringLength(args[0], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);

#ifdef DOS
  if (unixpathname(fbuf, file, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, file, 0, 0) == 0) return (NIL);
#endif /* DOS */
  /* check if we're operating on directory or file */
  TIMEOUT(rval = stat(file, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  /*
   * On UNIX device, all we have to do is just to unlink the file
   * or directory
   */
  if (S_ISDIR(sbuf.st_mode)) {
    TIMEOUT(rval = rmdir(file));
  } else {
    TIMEOUT(rval = unlink(file));
  }
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  return (ATOM_T);
}